

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O3

void __thiscall
spirv_cross::SmallVector<spirv_cross::Resource,_8UL>::reserve
          (SmallVector<spirv_cross::Resource,_8UL> *this,size_t count)

{
  char *pcVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  void *pvVar4;
  undefined8 uVar5;
  ulong uVar6;
  Resource *pRVar7;
  Resource *pRVar8;
  long lVar9;
  ulong uVar10;
  
  if (count < 0x555555555555556) {
    uVar6 = this->buffer_capacity;
    if (uVar6 < count) {
      uVar10 = 8;
      if (8 < uVar6) {
        uVar10 = uVar6;
      }
      do {
        uVar6 = uVar10;
        uVar10 = uVar6 * 2;
      } while (uVar6 < count);
      if (uVar6 < 9) {
        pRVar7 = (Resource *)&this->stack_storage;
      }
      else {
        pRVar7 = (Resource *)malloc(uVar6 * 0x30);
        if (pRVar7 == (Resource *)0x0) goto LAB_001a6e28;
      }
      pRVar8 = (this->super_VectorView<spirv_cross::Resource>).ptr;
      if ((pRVar7 != pRVar8) && ((this->super_VectorView<spirv_cross::Resource>).buffer_size != 0))
      {
        lVar9 = 0x20;
        uVar10 = 0;
        do {
          pcVar1 = (char *)((long)&(pRVar7->id).id + lVar9);
          pRVar8 = (this->super_VectorView<spirv_cross::Resource>).ptr;
          puVar2 = (undefined8 *)((long)&(pRVar8->id).id + lVar9);
          *(undefined4 *)((long)pRVar7 + lVar9 + -0x18) =
               *(undefined4 *)((long)pRVar8 + lVar9 + -0x18);
          *(undefined8 *)((long)pRVar7 + lVar9 + -0x20) =
               *(undefined8 *)((long)pRVar8 + lVar9 + -0x20);
          *(char **)((long)pRVar7 + lVar9 + -0x10) = pcVar1;
          puVar3 = *(undefined8 **)((long)pRVar8 + lVar9 + -0x10);
          if (puVar2 == puVar3) {
            uVar5 = puVar2[1];
            *(undefined8 *)pcVar1 = *puVar2;
            *(undefined8 *)(pcVar1 + 8) = uVar5;
          }
          else {
            *(undefined8 **)((long)pRVar7 + lVar9 + -0x10) = puVar3;
            *(undefined8 *)((long)&(pRVar7->id).id + lVar9) = *puVar2;
          }
          *(undefined8 *)((long)pRVar7 + lVar9 + -8) = *(undefined8 *)((long)pRVar8 + lVar9 + -8);
          *(undefined8 **)((long)pRVar8 + lVar9 + -0x10) = puVar2;
          *(undefined8 *)((long)pRVar8 + lVar9 + -8) = 0;
          *(undefined1 *)((long)&(pRVar8->id).id + lVar9) = 0;
          pRVar8 = (this->super_VectorView<spirv_cross::Resource>).ptr;
          pvVar4 = *(void **)((long)pRVar8 + lVar9 + -0x10);
          if ((void *)((long)&(pRVar8->id).id + lVar9) != pvVar4) {
            operator_delete(pvVar4);
          }
          uVar10 = uVar10 + 1;
          lVar9 = lVar9 + 0x30;
        } while (uVar10 < (this->super_VectorView<spirv_cross::Resource>).buffer_size);
        pRVar8 = (this->super_VectorView<spirv_cross::Resource>).ptr;
      }
      if (pRVar8 != (Resource *)&this->stack_storage) {
        free(pRVar8);
      }
      (this->super_VectorView<spirv_cross::Resource>).ptr = pRVar7;
      this->buffer_capacity = uVar6;
    }
    return;
  }
LAB_001a6e28:
  ::std::terminate();
}

Assistant:

void reserve(size_t count) SPIRV_CROSS_NOEXCEPT
	{
		if ((count > std::numeric_limits<size_t>::max() / sizeof(T)) ||
		    (count > std::numeric_limits<size_t>::max() / 2))
		{
			// Only way this should ever happen is with garbage input, terminate.
			std::terminate();
		}

		if (count > buffer_capacity)
		{
			size_t target_capacity = buffer_capacity;
			if (target_capacity == 0)
				target_capacity = 1;

			// Weird parens works around macro issues on Windows if NOMINMAX is not used.
			target_capacity = (std::max)(target_capacity, N);

			// Need to ensure there is a POT value of target capacity which is larger than count,
			// otherwise this will overflow.
			while (target_capacity < count)
				target_capacity <<= 1u;

			T *new_buffer =
			    target_capacity > N ? static_cast<T *>(malloc(target_capacity * sizeof(T))) : stack_storage.data();

			// If we actually fail this malloc, we are hosed anyways, there is no reason to attempt recovery.
			if (!new_buffer)
				std::terminate();

			// In case for some reason two allocations both come from same stack.
			if (new_buffer != this->ptr)
			{
				// We don't deal with types which can throw in move constructor.
				for (size_t i = 0; i < this->buffer_size; i++)
				{
					new (&new_buffer[i]) T(std::move(this->ptr[i]));
					this->ptr[i].~T();
				}
			}

			if (this->ptr != stack_storage.data())
				free(this->ptr);
			this->ptr = new_buffer;
			buffer_capacity = target_capacity;
		}
	}